

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldTest_SettersOverrideTheDataProperly_Test::TestBody
          (UnknownFieldTest_SettersOverrideTheDataProperly_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  UnknownField *pUVar4;
  AssertHelper local_f18;
  Message local_f10;
  undefined1 local_f08 [8];
  AssertionResult gtest_ar_9;
  string_view local_bb8;
  Cord local_ba8;
  AssertHelper local_b98;
  Message local_b90;
  undefined1 local_b88 [8];
  AssertionResult gtest_ar_8;
  allocator<char> local_831;
  string local_830;
  AssertHelper local_810;
  Message local_808;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_7;
  Message local_7e8;
  int local_7dc;
  uint64_t local_7d8;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_6;
  Message local_7b8;
  int local_7b0;
  uint32_t local_7ac;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_5;
  Message local_790;
  int local_788;
  int32_t local_784;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_4;
  string_view local_430;
  AssertHelper local_420;
  Message local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_3;
  Message local_3f8;
  int local_3ec;
  uint64_t local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_2;
  Message local_3c8;
  int local_3c0;
  uint32_t local_3bc;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_1;
  Message local_3a0;
  int local_398;
  int32_t local_394;
  undefined1 local_390 [8];
  AssertionResult gtest_ar;
  T message;
  undefined1 local_20 [8];
  UnknownFieldSet set;
  UnknownFieldTest_SettersOverrideTheDataProperly_Test *this_local;
  
  set.fields_.soo_rep_.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)this;
  UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)local_20);
  UnknownFieldSet::AddVarint((UnknownFieldSet *)local_20,1,2);
  UnknownFieldSet::AddFixed32((UnknownFieldSet *)local_20,7,3);
  UnknownFieldSet::AddFixed64((UnknownFieldSet *)local_20,8,4);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&message.field_0 + 0x328),
             "5");
  UnknownFieldSet::AddLengthDelimited((UnknownFieldSet *)local_20,0xe,stack0xffffffffffffffc0);
  UnknownToProto<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)&gtest_ar.message_,(UnknownFieldSet *)local_20);
  local_394 = proto2_unittest::TestAllTypes::optional_int32((TestAllTypes *)&gtest_ar.message_);
  local_398 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_390,"message.optional_int32()","2",&local_394,&local_398);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x358,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_3bc = proto2_unittest::TestAllTypes::optional_fixed32((TestAllTypes *)&gtest_ar.message_);
  local_3c0 = 3;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_3b8,"message.optional_fixed32()","3",&local_3bc,&local_3c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x359,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  local_3e8 = proto2_unittest::TestAllTypes::optional_fixed64((TestAllTypes *)&gtest_ar.message_);
  local_3ec = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3e0,"message.optional_fixed64()","4",&local_3e8,&local_3ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x35a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  psVar3 = proto2_unittest::TestAllTypes::optional_string_abi_cxx11_
                     ((TestAllTypes *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_410,"message.optional_string()","\"5\"",psVar3,
             (char (*) [2])0x1ce9a9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x35b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  pUVar4 = UnknownFieldSet::mutable_field((UnknownFieldSet *)local_20,0);
  UnknownField::set_varint(pUVar4,0x16);
  pUVar4 = UnknownFieldSet::mutable_field((UnknownFieldSet *)local_20,1);
  UnknownField::set_fixed32(pUVar4,0x21);
  pUVar4 = UnknownFieldSet::mutable_field((UnknownFieldSet *)local_20,2);
  UnknownField::set_fixed64(pUVar4,0x2c);
  pUVar4 = UnknownFieldSet::mutable_field((UnknownFieldSet *)local_20,3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_430,"55");
  UnknownField::set_length_delimited(pUVar4,local_430);
  UnknownToProto<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)&gtest_ar_4.message_,(UnknownFieldSet *)local_20);
  proto2_unittest::TestAllTypes::operator=
            ((TestAllTypes *)&gtest_ar.message_,(TestAllTypes *)&gtest_ar_4.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&gtest_ar_4.message_);
  local_784 = proto2_unittest::TestAllTypes::optional_int32((TestAllTypes *)&gtest_ar.message_);
  local_788 = 0x16;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_780,"message.optional_int32()","22",&local_784,&local_788);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(&local_790);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x364,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_790);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  local_7ac = proto2_unittest::TestAllTypes::optional_fixed32((TestAllTypes *)&gtest_ar.message_);
  local_7b0 = 0x21;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_7a8,"message.optional_fixed32()","33",&local_7ac,&local_7b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x365,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  local_7d8 = proto2_unittest::TestAllTypes::optional_fixed64((TestAllTypes *)&gtest_ar.message_);
  local_7dc = 0x2c;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_7d0,"message.optional_fixed64()","44",&local_7d8,&local_7dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x366,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  psVar3 = proto2_unittest::TestAllTypes::optional_string_abi_cxx11_
                     ((TestAllTypes *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_800,"message.optional_string()","\"55\"",psVar3,
             (char (*) [3])0x1df49f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar1) {
    testing::Message::Message(&local_808);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              (&local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x367,pcVar2);
    testing::internal::AssertHelper::operator=(&local_810,&local_808);
    testing::internal::AssertHelper::~AssertHelper(&local_810);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  pUVar4 = UnknownFieldSet::mutable_field((UnknownFieldSet *)local_20,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"555",&local_831);
  UnknownField::set_length_delimited<>(pUVar4,&local_830);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  UnknownToProto<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)&gtest_ar_8.message_,(UnknownFieldSet *)local_20);
  proto2_unittest::TestAllTypes::operator=
            ((TestAllTypes *)&gtest_ar.message_,(TestAllTypes *)&gtest_ar_8.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&gtest_ar_8.message_);
  psVar3 = proto2_unittest::TestAllTypes::optional_string_abi_cxx11_
                     ((TestAllTypes *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_b88,"message.optional_string()","\"555\"",psVar3,
             (char (*) [4])0x1e07db2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b88);
  if (!bVar1) {
    testing::Message::Message(&local_b90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b88);
    testing::internal::AssertHelper::AssertHelper
              (&local_b98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x36b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b98,&local_b90);
    testing::internal::AssertHelper::~AssertHelper(&local_b98);
    testing::Message::~Message(&local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b88);
  pUVar4 = UnknownFieldSet::mutable_field((UnknownFieldSet *)local_20,3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_bb8,"5555");
  absl::lts_20250127::Cord::Cord(&local_ba8,local_bb8);
  UnknownField::set_length_delimited(pUVar4,&local_ba8);
  absl::lts_20250127::Cord::~Cord(&local_ba8);
  UnknownToProto<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)&gtest_ar_9.message_,(UnknownFieldSet *)local_20);
  proto2_unittest::TestAllTypes::operator=
            ((TestAllTypes *)&gtest_ar.message_,(TestAllTypes *)&gtest_ar_9.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&gtest_ar_9.message_);
  psVar3 = proto2_unittest::TestAllTypes::optional_string_abi_cxx11_
                     ((TestAllTypes *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_f08,"message.optional_string()","\"5555\"",psVar3,
             (char (*) [5])"5555");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f08);
  if (!bVar1) {
    testing::Message::Message(&local_f10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f08);
    testing::internal::AssertHelper::AssertHelper
              (&local_f18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x36f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f18,&local_f10);
    testing::internal::AssertHelper::~AssertHelper(&local_f18);
    testing::Message::~Message(&local_f10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f08);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&gtest_ar.message_);
  UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)local_20);
  return;
}

Assistant:

TEST(UnknownFieldTest, SettersOverrideTheDataProperly) {
  using T = unittest::TestAllTypes;
  UnknownFieldSet set;
  set.AddVarint(T::kOptionalInt32FieldNumber, 2);
  set.AddFixed32(T::kOptionalFixed32FieldNumber, 3);
  set.AddFixed64(T::kOptionalFixed64FieldNumber, 4);
  set.AddLengthDelimited(T::kOptionalStringFieldNumber, "5");

  T message = UnknownToProto<T>(set);

  EXPECT_EQ(message.optional_int32(), 2);
  EXPECT_EQ(message.optional_fixed32(), 3);
  EXPECT_EQ(message.optional_fixed64(), 4);
  EXPECT_EQ(message.optional_string(), "5");

  set.mutable_field(0)->set_varint(22);
  set.mutable_field(1)->set_fixed32(33);
  set.mutable_field(2)->set_fixed64(44);
  set.mutable_field(3)->set_length_delimited("55");

  message = UnknownToProto<T>(set);

  EXPECT_EQ(message.optional_int32(), 22);
  EXPECT_EQ(message.optional_fixed32(), 33);
  EXPECT_EQ(message.optional_fixed64(), 44);
  EXPECT_EQ(message.optional_string(), "55");

  set.mutable_field(3)->set_length_delimited(std::string("555"));
  message = UnknownToProto<T>(set);
  EXPECT_EQ(message.optional_string(), "555");

  set.mutable_field(3)->set_length_delimited(absl::Cord("5555"));
  message = UnknownToProto<T>(set);
  EXPECT_EQ(message.optional_string(), "5555");
}